

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# per_support.c
# Opt level: O2

int uper_put_nsnnwn(asn_per_outp_t *po,int n)

{
  uint32_t bits;
  int iVar1;
  
  if (n < 0x40) {
    if (n < 0) {
      return -1;
    }
    iVar1 = 7;
  }
  else {
    if ((uint)n < 0x100) {
      bits = 1;
    }
    else if ((uint)n < 0x10000) {
      bits = 2;
    }
    else {
      if (0xffffff < (uint)n) {
        return -1;
      }
      bits = 3;
    }
    iVar1 = per_put_few_bits(po,bits,8);
    if (iVar1 != 0) {
      return -1;
    }
    iVar1 = bits << 3;
  }
  iVar1 = per_put_few_bits(po,n,iVar1);
  return iVar1;
}

Assistant:

int
uper_put_nsnnwn(asn_per_outp_t *po, int n) {
	int bytes;

	if(n <= 63) {
		if(n < 0) return -1;
		return per_put_few_bits(po, n, 7);
	}
	if(n < 256)
		bytes = 1;
	else if(n < 65536)
		bytes = 2;
	else if(n < 256 * 65536)
		bytes = 3;
	else
		return -1;	/* This is not a "normally small" value */
	if(per_put_few_bits(po, bytes, 8))
		return -1;

	return per_put_few_bits(po, n, 8 * bytes);
}